

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_UInt32 * tt_cmap14_char_variants(TT_CMap cmap,FT_Memory memory,FT_UInt32 charCode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  FT_Byte *pFVar5;
  FT_Error FVar6;
  FT_UInt FVar7;
  FT_CMap_Class pFVar8;
  byte *pbVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  FT_CMap_Class local_48;
  
  iVar12 = *(int *)&cmap[1].cmap.charmap.face;
  pFVar5 = cmap->data;
  FVar6 = tt_cmap14_ensure((TT_CMap14)cmap,iVar12 + 1,memory);
  if (FVar6 == 0) {
    pFVar8 = cmap[1].cmap.clazz;
    local_48 = pFVar8;
    if (iVar12 != 0) {
      pbVar9 = pFVar5 + 10;
      do {
        bVar1 = *pbVar9;
        bVar2 = pbVar9[1];
        bVar3 = pbVar9[2];
        uVar10 = *(uint *)(pbVar9 + 3);
        uVar4 = *(uint *)(pbVar9 + 7);
        uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
        ;
        if (uVar10 == 0) {
LAB_0015d069:
          uVar11 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                          uVar4 << 0x18);
          if (uVar11 != 0) {
            FVar7 = tt_cmap14_char_map_nondef_binary(cmap->data + uVar11,charCode);
            if (FVar7 != 0) goto LAB_0015d08a;
          }
        }
        else {
          FVar7 = tt_cmap14_char_map_def_binary(cmap->data + uVar10,charCode);
          if (FVar7 == 0) goto LAB_0015d069;
LAB_0015d08a:
          *(uint *)&local_48->size = (uint)bVar2 << 8 | (uint)bVar1 << 0x10 | (uint)bVar3;
          local_48 = (FT_CMap_Class)((long)&local_48->size + 4);
        }
        pbVar9 = pbVar9 + 0xb;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    *(FT_UInt32 *)&local_48->size = 0;
  }
  else {
    pFVar8 = (FT_CMap_Class)0x0;
  }
  return (FT_UInt32 *)pFVar8;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 * )
  tt_cmap14_char_variants( TT_CMap    cmap,
                           FT_Memory  memory,
                           FT_UInt32  charCode )
  {
    TT_CMap14   cmap14 = (TT_CMap14)  cmap;
    FT_UInt32   count  = cmap14->num_selectors;
    FT_Byte*    p      = cmap->data + 10;
    FT_UInt32*  q;


    if ( tt_cmap14_ensure( cmap14, ( count + 1 ), memory ) )
      return NULL;

    for ( q = cmap14->results; count > 0; count-- )
    {
      FT_UInt32  varSel    = TT_NEXT_UINT24( p );
      FT_ULong   defOff    = TT_NEXT_ULONG( p );
      FT_ULong   nondefOff = TT_NEXT_ULONG( p );


      if ( ( defOff != 0                                               &&
             tt_cmap14_char_map_def_binary( cmap->data + defOff,
                                            charCode )                 ) ||
           ( nondefOff != 0                                            &&
             tt_cmap14_char_map_nondef_binary( cmap->data + nondefOff,
                                               charCode ) != 0         ) )
      {
        q[0] = varSel;
        q++;
      }
    }
    q[0] = 0;

    return cmap14->results;
  }